

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::internal::MatchMatrix::Randomize(MatchMatrix *this)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  size_t ilhs;
  ulong uVar4;
  size_t irhs;
  ulong uVar5;
  
  for (uVar4 = 0; uVar4 < *(ulong *)this; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar1 = *(ulong *)(this + 8), uVar5 < uVar1; uVar5 = uVar5 + 1) {
      lVar2 = *(long *)(this + 0x10);
      iVar3 = rand();
      *(byte *)(uVar5 + uVar1 * uVar4 + lVar2) = (byte)iVar3 & 1;
    }
  }
  return;
}

Assistant:

void MatchMatrix::Randomize() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      b = static_cast<char>(rand() & 1);  // NOLINT
    }
  }
}